

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexturehelper.cpp
# Opt level: O2

void __thiscall
QOpenGLTextureHelper::qt_TextureImage2D
          (QOpenGLTextureHelper *this,GLuint texture,GLenum target,GLenum bindingTarget,GLint level,
          GLenum internalFormat,GLsizei width,GLsizei height,GLint border,GLenum format,GLenum type,
          GLvoid *pixels)

{
  long in_FS_OFFSET;
  undefined1 local_48 [12];
  GLint GStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  stack0xffffffffffffffc0 = &DAT_aaaaaaaaaaaaaaaa;
  anon_unknown.dwarf_1b4087::TextureBinder::TextureBinder
            ((TextureBinder *)local_48,this->functions,texture,target,bindingTarget);
  (**(code **)(*(long *)this->functions + 0x140))
            (target,level,internalFormat,width,height,border,format,type,pixels);
  (*(code *)**(undefined8 **)local_48._0_8_)((ulong)stack0xffffffffffffffc0 & 0xffffffff,GStack_3c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLTextureHelper::qt_TextureImage2D(GLuint texture, GLenum target, GLenum bindingTarget, GLint level, GLenum internalFormat, GLsizei width, GLsizei height, GLint border, GLenum format, GLenum type, const GLvoid *pixels)
{
    TextureBinder binder(functions, texture, target, bindingTarget);
    functions->glTexImage2D(target, level, internalFormat, width, height, border, format, type, pixels);
}